

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

bool __thiscall TxRequestTracker::Impl::MakeCompleted(Impl *this,Iter<ByTxHash> it)

{
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar1;
  pointer poVar2;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  *poVar3;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  *poVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  impl_pointer xi;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  poVar1 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  if (poVar1 == (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)it.node) {
    __assert_fail("it != m_index.get<ByTxHash>().end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                  ,0x1d4,"bool TxRequestTracker::Impl::MakeCompleted(Iter<ByTxHash>)");
  }
  bVar7 = true;
  if ((uint)((ulong)*(undefined8 *)
                     ((long)&((it.node)->
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                             ).
                             super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                             .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                             data_ + 0x30) >> 0x3d) == 4) goto LAB_003e5bc1;
  poVar2 = (poVar1->
           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
           ).
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
           .
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  poVar4 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
            *)&poVar2[-4].
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    poVar4 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
              *)0x0;
  }
  if (poVar4 == it.node) {
LAB_003e5ab6:
    poVar3 = &(it.node)->
              super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
    ;
    local_58 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                *)poVar3;
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::increment((pointer *)&local_58);
    if (local_58 !=
        (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
         *)0x0) {
      local_58 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                  *)((long)&local_58[-1].
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                            .
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            .
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + 0x30);
    }
    if (local_58 !=
        (this->m_index).
        super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
        .member) {
      local_58 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                  *)poVar3;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_58);
      pcVar5 = (char *)((long)local_58 + -0x60 + 0x10);
      if (local_58 ==
          (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)0x0) {
        pcVar5 = (char *)0x0;
      }
      auVar13[0] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0]
                    == *pcVar5);
      auVar13[1] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[1]
                    == pcVar5[1]);
      auVar13[2] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[2]
                    == pcVar5[2]);
      auVar13[3] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[3]
                    == pcVar5[3]);
      auVar13[4] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[4]
                    == pcVar5[4]);
      auVar13[5] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[5]
                    == pcVar5[5]);
      auVar13[6] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[6]
                    == pcVar5[6]);
      auVar13[7] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[7]
                    == pcVar5[7]);
      auVar13[8] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[8]
                    == pcVar5[8]);
      auVar13[9] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[9]
                    == pcVar5[9]);
      auVar13[10] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [10] == pcVar5[10]);
      auVar13[0xb] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xb] == pcVar5[0xb]);
      auVar13[0xc] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xc] == pcVar5[0xc]);
      auVar13[0xd] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xd] == pcVar5[0xd]);
      auVar13[0xe] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xe] == pcVar5[0xe]);
      auVar13[0xf] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xf] == pcVar5[0xf]);
      auVar9[0] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x10] == pcVar5[0x10]);
      auVar9[1] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x11] == pcVar5[0x11]);
      auVar9[2] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x12] == pcVar5[0x12]);
      auVar9[3] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x13] == pcVar5[0x13]);
      auVar9[4] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x14] == pcVar5[0x14]);
      auVar9[5] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x15] == pcVar5[0x15]);
      auVar9[6] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x16] == pcVar5[0x16]);
      auVar9[7] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x17] == pcVar5[0x17]);
      auVar9[8] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x18] == pcVar5[0x18]);
      auVar9[9] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x19] == pcVar5[0x19]);
      auVar9[10] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x1a] == pcVar5[0x1a]);
      auVar9[0xb] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0x1b] == pcVar5[0x1b]);
      auVar9[0xc] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0x1c] == pcVar5[0x1c]);
      auVar9[0xd] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0x1d] == pcVar5[0x1d]);
      auVar9[0xe] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0x1e] == pcVar5[0x1e]);
      auVar9[0xf] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0x1f] == pcVar5[0x1f]);
      auVar9 = auVar9 & auVar13;
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
        local_58 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                    *)poVar3;
        boost::multi_index::detail::
        ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
        ::increment((pointer *)&local_58);
        lVar6 = (long)local_58 + -0x60 + 0x10;
        if (local_58 ==
            (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)0x0) {
          lVar6 = 0;
        }
        if ((*(ulong *)(lVar6 + 0x30) & 0xe000000000000000) != 0x8000000000000000)
        goto LAB_003e5bb1;
      }
    }
    local_58 = *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 **)&((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_;
    uStack_50 = *(undefined8 *)
                 ((long)&((it.node)->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         ).
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                 8);
    local_48 = *(undefined8 *)
                ((long)&((it.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                0x10);
    uStack_40 = *(undefined8 *)
                 ((long)&((it.node)->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         ).
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                 0x18);
    do {
      it.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                 *)Erase<(anonymous_namespace)::ByTxHash>(this,it.node);
      if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)it.node ==
          (this->m_index).
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
          .member) break;
      auVar11[0] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x10] == (char)local_48);
      auVar11[1] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x11] == local_48._1_1_);
      auVar11[2] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x12] == local_48._2_1_);
      auVar11[3] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x13] == local_48._3_1_);
      auVar11[4] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x14] == local_48._4_1_);
      auVar11[5] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x15] == local_48._5_1_);
      auVar11[6] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x16] == local_48._6_1_);
      auVar11[7] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x17] == local_48._7_1_);
      auVar11[8] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x18] == (char)uStack_40);
      auVar11[9] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0x19] == uStack_40._1_1_);
      auVar11[10] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [0x1a] == uStack_40._2_1_);
      auVar11[0xb] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x1b] == uStack_40._3_1_);
      auVar11[0xc] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x1c] == uStack_40._4_1_);
      auVar11[0xd] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x1d] == uStack_40._5_1_);
      auVar11[0xe] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x1e] == uStack_40._6_1_);
      auVar11[0xf] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x1f] == uStack_40._7_1_);
      auVar10[0] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0]
                    == (char)local_58);
      auVar10[1] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[1]
                    == local_58._1_1_);
      auVar10[2] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[2]
                    == local_58._2_1_);
      auVar10[3] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[3]
                    == local_58._3_1_);
      auVar10[4] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[4]
                    == local_58._4_1_);
      auVar10[5] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[5]
                    == local_58._5_1_);
      auVar10[6] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[6]
                    == local_58._6_1_);
      auVar10[7] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[7]
                    == local_58._7_1_);
      auVar10[8] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[8]
                    == (char)uStack_50);
      auVar10[9] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[9]
                    == uStack_50._1_1_);
      auVar10[10] = -(((it.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                      [10] == uStack_50._2_1_);
      auVar10[0xb] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xb] == uStack_50._3_1_);
      auVar10[0xc] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xc] == uStack_50._4_1_);
      auVar10[0xd] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xd] == uStack_50._5_1_);
      auVar10[0xe] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xe] == uStack_50._6_1_);
      auVar10[0xf] = -(((it.node)->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       ).
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0xf] == uStack_50._7_1_);
      auVar10 = auVar10 & auVar11;
    } while ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
    bVar7 = false;
  }
  else {
    local_58 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                *)&(it.node)->
                   super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
    ;
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::decrement((pointer *)&local_58);
    poVar3 = (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
              *)local_58;
    if (local_58 !=
        (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
         *)0x0) {
      poVar3 = (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                *)((long)local_58 + -0x60 + 0x10);
    }
    auVar12[0] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0]
                  == (char)(poVar3->
                           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                           ).
                           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                           .super_type.parentcolor_);
    auVar12[1] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[1]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 1));
    auVar12[2] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[2]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 2));
    auVar12[3] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[3]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 3));
    auVar12[4] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[4]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 4));
    auVar12[5] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[5]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 5));
    auVar12[6] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[6]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 6));
    auVar12[7] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[7]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.parentcolor_ + 7));
    auVar12[8] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[8]
                  == *(char *)&(poVar3->
                               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                               ).
                               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                               .super_type.left_);
    auVar12[9] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[9]
                  == *(char *)((long)&(poVar3->
                                      super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      ).
                                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                      .super_type.left_ + 1));
    auVar12[10] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[10]
                   == *(char *)((long)&(poVar3->
                                       super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                       ).
                                       super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                       .super_type.left_ + 2));
    auVar12[0xb] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0xb] == *(char *)((long)&(poVar3->
                                               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               ).
                                               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               .super_type.left_ + 3));
    auVar12[0xc] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0xc] == *(char *)((long)&(poVar3->
                                               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               ).
                                               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               .super_type.left_ + 4));
    auVar12[0xd] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0xd] == *(char *)((long)&(poVar3->
                                               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               ).
                                               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               .super_type.left_ + 5));
    auVar12[0xe] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0xe] == *(char *)((long)&(poVar3->
                                               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               ).
                                               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               .super_type.left_ + 6));
    auVar12[0xf] = -(((it.node)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     ).
                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                     [0xf] == *(char *)((long)&(poVar3->
                                               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               ).
                                               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                               .super_type.left_ + 7));
    auVar8[0] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x10]
                 == *(char *)&(poVar3->
                              super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                              ).
                              super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                              .super_type.right_);
    auVar8[1] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x11]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 1));
    auVar8[2] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x12]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 2));
    auVar8[3] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x13]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 3));
    auVar8[4] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x14]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 4));
    auVar8[5] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x15]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 5));
    auVar8[6] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x16]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 6));
    auVar8[7] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x17]
                 == *(char *)((long)&(poVar3->
                                     super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     ).
                                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                                     .super_type.right_ + 7));
    auVar8[8] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x18]
                 == *(char *)(poVar3 + 1));
    auVar8[9] = -(((it.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  ).
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf[0x19]
                 == *(char *)((long)(poVar3 + 1) + 1));
    auVar8[10] = -(((it.node)->
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   ).
                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                   [0x1a] == *(char *)((long)(poVar3 + 1) + 2));
    auVar8[0xb] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x1b] == *(char *)((long)(poVar3 + 1) + 3));
    auVar8[0xc] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x1c] == *(char *)((long)(poVar3 + 1) + 4));
    auVar8[0xd] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x1d] == *(char *)((long)(poVar3 + 1) + 5));
    auVar8[0xe] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x1e] == *(char *)((long)(poVar3 + 1) + 6));
    auVar8[0xf] = -(((it.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                    [0x1f] == *(char *)((long)(poVar3 + 1) + 7));
    auVar8 = auVar8 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) goto LAB_003e5ab6;
LAB_003e5bb1:
    ChangeAndReselect(this,it,COMPLETED);
  }
LAB_003e5bc1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool MakeCompleted(Iter<ByTxHash> it)
    {
        assert(it != m_index.get<ByTxHash>().end());

        // Nothing to be done if it's already COMPLETED.
        if (it->GetState() == State::COMPLETED) return true;

        if (IsOnlyNonCompleted(it)) {
            // This is the last non-COMPLETED announcement for this txhash. Delete all.
            uint256 txhash = it->m_txhash;
            do {
                it = Erase<ByTxHash>(it);
            } while (it != m_index.get<ByTxHash>().end() && it->m_txhash == txhash);
            return false;
        }

        // Mark the announcement COMPLETED, and select the next best announcement (the first CANDIDATE_READY) if
        // needed.
        ChangeAndReselect(it, State::COMPLETED);

        return true;
    }